

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O2

LengthUnitSystem
Internal_DimensionLengthDisplay
          (ON_ModelComponent *model_component,LengthDisplay dim_length_display,uint model_sn)

{
  LengthUnitSystem LVar1;
  
  LVar1 = ON_DimStyle::LengthUnitSystemFromLengthDisplay(dim_length_display);
  if (LVar1 == None) {
    if (model_sn == 0xffffffff) {
      model_sn = ON_ModelComponent::ModelSerialNumber(model_component);
    }
    if (model_sn != 0) {
      LVar1 = ON::ModelLengthUnitSystem((ulong)model_sn);
      return LVar1;
    }
    LVar1 = None;
  }
  return LVar1;
}

Assistant:

static ON::LengthUnitSystem Internal_DimensionLengthDisplay(
  const ON_ModelComponent& model_component,
  ON_DimStyle::LengthDisplay dim_length_display,
  unsigned int model_sn
)
{
  ON::LengthUnitSystem us = ON_DimStyle::LengthUnitSystemFromLengthDisplay(dim_length_display);
  if (ON::LengthUnitSystem::None == us)
  {
    if (ON_UNSET_UINT_INDEX == model_sn)
      model_sn = model_component.ModelSerialNumber();
    if ( model_sn > 0)
      us = ON::ModelLengthUnitSystem(model_sn);
  }
  return us;
}